

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool __thiscall bssl::is_decimal_component(bssl *this,Span<const_unsigned_char> in)

{
  bool bVar1;
  iterator puVar2;
  uint8_t b;
  iterator __end1;
  iterator __begin1;
  Span<const_unsigned_char> *__range1;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = in.data_;
  __range1 = (Span<const_unsigned_char> *)this;
  bVar1 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&__range1);
  if (bVar1) {
    in_local.size_._7_1_ = false;
  }
  else {
    __end1 = Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)&__range1);
    puVar2 = Span<const_unsigned_char>::end((Span<const_unsigned_char> *)&__range1);
    for (; __end1 != puVar2; __end1 = __end1 + 1) {
      if ((*__end1 < 0x30) || (0x39 < *__end1)) {
        return false;
      }
    }
    in_local.size_._7_1_ = true;
  }
  return in_local.size_._7_1_;
}

Assistant:

static bool is_decimal_component(Span<const uint8_t> in) {
  if (in.empty()) {
    return false;
  }
  for (uint8_t b : in) {
    if (!('0' <= b && b <= '9')) {
      return false;
    }
  }
  return true;
}